

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

QString * __thiscall
QCompleter::pathFromIndex(QString *__return_storage_ptr__,QCompleter *this,QModelIndex *index)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  long *plVar6;
  QObject *object;
  QFileSystemModel *pQVar7;
  QArrayDataPointer<char16_t> *other;
  long in_FS_OFFSET;
  Data *local_d8;
  char16_t *pcStack_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<QString> local_98;
  Data *local_78;
  char16_t *pcStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  bVar5 = QModelIndex::isValid(index);
  if ((bVar5) && (plVar6 = (long *)QAbstractProxyModel::sourceModel(), plVar6 != (long *)0x0)) {
    object = (QObject *)QAbstractProxyModel::sourceModel();
    pQVar7 = QtPrivate::qobject_cast_helper<QFileSystemModel*,QObject>(object);
    if (pQVar7 == (QFileSystemModel *)0x0) {
      (**(code **)(*plVar6 + 0x90))(&local_58,plVar6,index,*(undefined4 *)(lVar1 + 0xbc));
      ::QVariant::toString();
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      local_68.ptr = (index->m).ptr;
      local_78 = *(Data **)index;
      pcStack_70 = (char16_t *)index->i;
      local_98.d = (Data *)0x0;
      local_98.ptr = (QString *)0x0;
      local_98.size = 0;
      do {
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (char16_t *)0x0;
        local_b8.size = 0;
        (**(code **)(*plVar6 + 0x90))(&local_58,plVar6,(QModelIndex *)&local_78,0x102);
        ::QVariant::toString();
        qVar4 = local_b8.size;
        pcVar3 = local_b8.ptr;
        pDVar2 = local_b8.d;
        local_b8.d = local_d8;
        local_b8.ptr = pcStack_d0;
        local_d8 = pDVar2;
        pcStack_d0 = pcVar3;
        local_b8.size = (qsizetype)local_c8.ptr;
        local_c8.ptr = (QAbstractItemModel *)qVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
        ::QVariant::~QVariant((QVariant *)&local_58);
        QList<QString>::emplaceFront<QString_const&>
                  ((QList<QString> *)&local_98,(QString *)&local_b8);
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::parent((QModelIndex *)&local_58,(QModelIndex *)&local_78);
        QModelIndex::sibling
                  ((QModelIndex *)&local_d8,(QModelIndex *)&local_58,local_58._0_4_,index->c);
        local_68.ptr = local_c8.ptr;
        local_78 = local_d8;
        pcStack_70 = pcStack_d0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        qVar4 = local_98.size;
        if (((int)local_78 < 0) || ((long)local_78 < 0)) break;
      } while (local_68.ptr != (QAbstractItemModel *)0x0);
      other = &QList<QString>::data((QList<QString> *)&local_98)->d;
      if (qVar4 == 1) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
      }
      else {
        QString::clear((QString *)other);
        QListSpecialMethods<QString>::join
                  (__return_storage_ptr__,(QListSpecialMethods<QString> *)&local_98,(QChar)0x2f);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCompleter::pathFromIndex(const QModelIndex& index) const
{
    Q_D(const QCompleter);
    if (!index.isValid())
        return QString();

    QAbstractItemModel *sourceModel = d->proxy->sourceModel();
    if (!sourceModel)
        return QString();
    bool isFsModel = false;
#if QT_CONFIG(filesystemmodel)
    isFsModel = qobject_cast<QFileSystemModel *>(d->proxy->sourceModel()) != nullptr;
#endif
    if (!isFsModel)
        return sourceModel->data(index, d->role).toString();

    QModelIndex idx = index;
    QStringList list;
    do {
        QString t;
#if QT_CONFIG(filesystemmodel)
        t = sourceModel->data(idx, QFileSystemModel::FileNameRole).toString();
#endif
        list.prepend(t);
        QModelIndex parent = idx.parent();
        idx = parent.sibling(parent.row(), index.column());
    } while (idx.isValid());

#if !defined(Q_OS_WIN)
    if (list.size() == 1) // only the separator or some other text
        return list[0];
    list[0].clear() ; // the join below will provide the separator
#endif

    return list.join(QDir::separator());
}